

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::SkipComment(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
              *this)

{
  Position *this_00;
  int *piVar1;
  bool bVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  
  this_00 = &this->m_position;
  pcVar3 = (this->m_position).m_pos;
  pcVar5 = (this->m_position).m_end;
  if (1 < (ulong)((long)pcVar5 - (long)pcVar3)) {
    pcVar7 = pcVar3;
    if (pcVar3 == pcVar5) {
      pcVar7 = "";
    }
    if ((*pcVar7 == '/') && (pcVar7[1] == '*')) {
      Position::operator+=(this_00,2);
      pcVar3 = (this->m_position).m_pos;
      pcVar5 = (this->m_position).m_end;
      do {
        if (pcVar3 == pcVar5) {
          return true;
        }
        if (1 < (ulong)((long)pcVar5 - (long)pcVar3)) {
          if (pcVar3 == pcVar5) {
            pcVar3 = "";
          }
          if ((*pcVar3 == '*') && (pcVar3[1] == '/')) {
            Position::operator+=(this_00,2);
            return true;
          }
        }
        bVar2 = Eol_(this,false);
        if (!bVar2) {
          Position::operator++(this_00);
        }
        pcVar3 = (this->m_position).m_pos;
        pcVar5 = (this->m_position).m_end;
      } while( true );
    }
    pcVar7 = pcVar3;
    if (pcVar3 == pcVar5) {
      pcVar7 = "";
    }
    if ((*pcVar7 == '/') && (pcVar7[1] == '/')) {
      Position::operator+=(this_00,2);
      pcVar3 = (this->m_position).m_pos;
      pcVar5 = (this->m_position).m_end;
      while( true ) {
        if (pcVar3 == pcVar5) {
          return true;
        }
        if (1 < (ulong)((long)pcVar5 - (long)pcVar3)) {
          pcVar7 = pcVar3;
          if (pcVar3 == pcVar5) {
            pcVar7 = "";
          }
          if ((*pcVar7 == '\r') && (pcVar7[1] == '\n')) {
            lVar8 = 2;
            Position::operator+=(this_00,2);
            iVar6 = (this->m_position).line;
            iVar4 = (this->m_position).col;
            pcVar3 = (this->m_position).m_pos;
            do {
              iVar4 = iVar4 + -1;
              if (pcVar3[lVar8 + -3] == '\n') {
                iVar4 = (this->m_position).m_last_col;
              }
              iVar6 = iVar6 - (uint)(pcVar3[lVar8 + -3] == '\n');
              lVar8 = lVar8 + -1;
            } while (lVar8 != 0);
            goto LAB_0032243c;
          }
        }
        if ((pcVar3 != pcVar5) && (*pcVar3 == '\n')) break;
        Position::operator++(this_00);
        pcVar3 = (this->m_position).m_pos;
        pcVar5 = (this->m_position).m_end;
      }
LAB_00322391:
      Position::operator++(this_00);
      pcVar3 = (this->m_position).m_pos;
      (this->m_position).m_pos = pcVar3 + -1;
      if (pcVar3[-1] == '\n') {
        (this->m_position).line = (this->m_position).line + -1;
        (this->m_position).col = (this->m_position).m_last_col;
      }
      else {
        piVar1 = &(this->m_position).col;
        *piVar1 = *piVar1 + -1;
      }
      return true;
    }
  }
  if ((pcVar5 == pcVar3) || (*pcVar3 != '#')) {
    return false;
  }
  Position::operator+=(this_00,1);
  pcVar3 = (this->m_position).m_pos;
  pcVar5 = (this->m_position).m_end;
  if (pcVar3 == pcVar5) {
    return true;
  }
  do {
    if (1 < (ulong)((long)pcVar5 - (long)pcVar3)) {
      pcVar7 = pcVar3;
      if (pcVar3 == pcVar5) {
        pcVar7 = "";
      }
      if ((*pcVar7 == '\r') && (pcVar7[1] == '\n')) {
        lVar8 = 2;
        Position::operator+=(this_00,2);
        iVar6 = (this->m_position).line;
        iVar4 = (this->m_position).col;
        pcVar3 = (this->m_position).m_pos;
        do {
          iVar4 = iVar4 + -1;
          if (pcVar3[lVar8 + -3] == '\n') {
            iVar4 = (this->m_position).m_last_col;
          }
          iVar6 = iVar6 - (uint)(pcVar3[lVar8 + -3] == '\n');
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
LAB_0032243c:
        (this->m_position).line = iVar6;
        (this->m_position).col = iVar4;
        (this->m_position).m_pos = pcVar3 + -2;
        return true;
      }
    }
    if ((pcVar3 != pcVar5) && (*pcVar3 == '\n')) goto LAB_00322391;
    Position::operator++(this_00);
    pcVar3 = (this->m_position).m_pos;
    pcVar5 = (this->m_position).m_end;
    if (pcVar3 == pcVar5) {
      return true;
    }
  } while( true );
}

Assistant:

bool SkipComment() {
        if (Symbol_(m_multiline_comment_begin)) {
          while (m_position.has_more()) {
            if (Symbol_(m_multiline_comment_end)) {
              break;
            } else if (!Eol_()) {
              ++m_position;
            }
          }
          return true;
        } else if (Symbol_(m_singleline_comment)) {
          while (m_position.has_more()) {
            if (Symbol_(m_cr_lf)) {
              m_position -= 2;
              break;
            } else if (Char_('\n')) {
              --m_position;
              break;
            } else {
              ++m_position;
            }
          }
          return true;
        } else if (Symbol_(m_annotation)) {
          while (m_position.has_more()) {
            if (Symbol_(m_cr_lf)) {
              m_position -= 2;
              break;
            } else if (Char_('\n')) {
              --m_position;
              break;
            } else {
              ++m_position;
            }
          }
          return true;
        }
        return false;
      }